

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_LU_mult_inplace(m256v *LU,int *inv_rowperm,int *colperm,m256v *X_inout)

{
  int *in_RDX;
  int *in_RSI;
  m256v Y;
  m256v X;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  m256v *in_stack_ffffffffffffffd0;
  
  m256v_get_subview(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  m256v_get_subview(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  if (in_RDX != (int *)0x0) {
    m256v_permute_rows((m256v *)&stack0xffffffffffffffc8,in_RDX);
  }
  m256v_U_mult_inplace
            (in_stack_ffffffffffffffd0,
             (m256v *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  m256v_L_mult_inplace
            (in_stack_ffffffffffffffd0,
             (m256v *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (in_RSI != (int *)0x0) {
    m256v_permute_rows((m256v *)&stack0xffffffffffffffb0,in_RSI);
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_mult_inplace)(const MV_GEN_TYPE* LU,
		   const int* inv_rowperm,
		   const int* colperm,
		   MV_GEN_TYPE* X_inout)
{
	/* Create the views for inputs & outputs
	 *
	 * The views access the same underlying backend storage,
	 * so some elements alias.  The number of rows of the views
	 * differ, however.
	 */
	assert(LU->n_col <= X_inout->n_row);
	assert(LU->n_row <= X_inout->n_row);
	MV_GEN_TYPE X = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_col, X_inout->n_col);
	MV_GEN_TYPE Y = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_row, X_inout->n_col);

	/* Apply the column permutation */
	if (colperm != NULL) {
		MV_GEN_N(_permute_rows)(&X, colperm);
	}

	MV_GEN_N(_U_mult_inplace)(LU, X_inout);
	MV_GEN_N(_L_mult_inplace)(LU, X_inout);

	/* Apply the row permutation */
	if (inv_rowperm != NULL) {
		MV_GEN_N(_permute_rows)(&Y, inv_rowperm);
	}
}